

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O2

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  long offset;
  bool bVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  mode_t mVar5;
  int iVar6;
  wchar_t wVar7;
  char *pcVar8;
  la_int64_t lVar9;
  char *pcVar10;
  size_t sVar12;
  int *piVar13;
  void *__value;
  size_t size;
  __off_t _Var14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint *puVar18;
  char *__s1;
  int iVar19;
  int local_10ec;
  char *local_10e8;
  ulong local_10e0;
  char *local_10d8;
  int local_10cc;
  stat s;
  int stflags;
  undefined8 local_1030;
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  uint local_ff0 [1008];
  ssize_t sVar11;
  
  local_10ec = fd;
  iVar3 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_entry_from_file");
  if (iVar3 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  pcVar8 = archive_entry_sourcepath(entry);
  if (pcVar8 == (char *)0x0) {
    pcVar8 = archive_entry_pathname(entry);
  }
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat *)0x0) {
      if (fd < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          st = &s;
          iVar3 = lstat(pcVar8,(stat *)st);
          if (iVar3 != 0) {
            piVar13 = __errno_location();
            iVar3 = *piVar13;
            pcVar10 = "Can\'t lstat %s";
            goto LAB_00121f9f;
          }
        }
        else {
          st = &s;
          iVar3 = stat(pcVar8,(stat *)st);
          if (iVar3 != 0) {
            piVar13 = __errno_location();
            iVar3 = *piVar13;
            pcVar10 = "Can\'t stat %s";
LAB_00121f9f:
            archive_set_error(_a,iVar3,pcVar10,pcVar8);
            return -0x19;
          }
        }
      }
      else {
        st = &s;
        iVar3 = fstat(fd,(stat *)st);
        if (iVar3 != 0) {
          piVar13 = __errno_location();
          iVar3 = *piVar13;
          pcVar8 = "Can\'t fstat";
          goto LAB_00121de1;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  lVar9 = archive_entry_uid(entry);
  pcVar10 = archive_read_disk_uname(_a,lVar9);
  if (pcVar10 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar10);
  }
  lVar9 = archive_entry_gid(entry);
  pcVar10 = archive_read_disk_gname(_a,lVar9);
  if (pcVar10 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar10);
  }
  if ((((ulong)_a[1].error_string.s & 0x40) == 0) && ((st->st_mode & 0xf000) == 0x4000)) {
    if (local_10ec < 0) {
      if (*(long *)&_a[1].archive_format == 0) {
        local_10ec = open(pcVar8,0x80800);
      }
      else {
        local_10ec = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar8,0x80800);
      }
      __archive_ensure_cloexec_flag(local_10ec);
      if (local_10ec < 0) goto LAB_00121d89;
    }
    iVar3 = ioctl(local_10ec,0x80086601,&stflags);
    if (stflags != 0 && iVar3 == 0) {
      archive_entry_set_fflags(entry,(long)stflags,0);
    }
  }
LAB_00121d89:
  if ((st->st_mode & 0xf000) == 0xa000) {
    sVar12 = st->st_size;
    pcVar10 = (char *)malloc(sVar12 + 1);
    if (pcVar10 == (char *)0x0) {
      pcVar8 = "Couldn\'t read link data";
      iVar3 = 0xc;
LAB_00121de1:
      archive_set_error(_a,iVar3,pcVar8);
      return -0x19;
    }
    if (*(long *)&_a[1].archive_format == 0) {
      sVar11 = readlink(pcVar8,pcVar10,sVar12);
      uVar4 = (uint)sVar11;
    }
    else {
      iVar3 = (**(code **)&_a[1].file_count)();
      sVar11 = readlinkat(iVar3,pcVar8,pcVar10,sVar12);
      uVar4 = (uint)sVar11;
    }
    if ((int)uVar4 < 0) {
      piVar13 = __errno_location();
      archive_set_error(_a,*piVar13,"Couldn\'t read link data");
      free(pcVar10);
      return -0x19;
    }
    pcVar10[uVar4 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar10);
    free(pcVar10);
  }
  iVar3 = 0;
  local_10cc = fd;
  if (((ulong)_a[1].error_string.s & 0x10) == 0) {
    if (local_10ec < 0) {
      pcVar8 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10ec);
      if (pcVar8 != (char *)0x0) {
        if (-1 < local_10ec) goto LAB_00121e49;
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          sVar12 = llistxattr(pcVar8,(char *)0x0,0);
        }
        else {
          sVar12 = listxattr(pcVar8,(char *)0x0,0);
        }
        goto LAB_00121e52;
      }
LAB_0012221d:
      iVar3 = -0x14;
    }
    else {
      pcVar8 = (char *)0x0;
LAB_00121e49:
      sVar12 = flistxattr(local_10ec,(char *)0x0,0);
LAB_00121e52:
      iVar3 = 0;
      if (sVar12 != 0) {
        if (sVar12 == 0xffffffffffffffff) {
          piVar13 = __errno_location();
          iVar6 = *piVar13;
          if ((iVar6 != 0x26) && (iVar3 = 0, iVar6 != 0x5f)) {
            archive_set_error(_a,iVar6,"Couldn\'t list extended attributes");
            goto LAB_0012221d;
          }
        }
        else {
          pcVar10 = (char *)malloc(sVar12);
          if (pcVar10 == (char *)0x0) {
            piVar13 = __errno_location();
            archive_set_error(_a,*piVar13,"Out of memory");
            iVar3 = -0x1e;
          }
          else {
            if (local_10ec < 0) {
              if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
                uVar15 = llistxattr(pcVar8,pcVar10,sVar12);
              }
              else {
                uVar15 = listxattr(pcVar8,pcVar10,sVar12);
              }
            }
            else {
              uVar15 = flistxattr(local_10ec,pcVar10,sVar12);
            }
            __s1 = pcVar10;
            pcVar2 = pcVar10;
            local_10e0 = uVar15;
            if (uVar15 == 0xffffffffffffffff) {
              piVar13 = __errno_location();
              archive_set_error(_a,*piVar13,"Couldn\'t retrieve extended attributes");
              free(pcVar10);
              goto LAB_0012221d;
            }
            for (; local_10d8 = pcVar8, local_10e8 = pcVar2,
                (long)__s1 - (long)pcVar10 < (long)uVar15; __s1 = __s1 + sVar12 + 1) {
              iVar3 = strncmp(__s1,"system.",7);
              if (iVar3 == 0) {
                iVar3 = strcmp(__s1 + 7,"posix_acl_access");
                if ((iVar3 != 0) && (iVar3 = strcmp(__s1 + 7,"posix_acl_default"), iVar3 != 0))
                goto LAB_00122016;
              }
              else {
LAB_00122016:
                iVar3 = strncmp(__s1,"trusted.SGI_",0xc);
                if (iVar3 == 0) {
                  iVar3 = strcmp(__s1 + 0xc,"ACL_DEFAULT");
                  if ((iVar3 == 0) || (iVar3 = strcmp(__s1 + 0xc,"ACL_FILE"), iVar3 == 0))
                  goto LAB_001221de;
                }
                iVar6 = strncmp(__s1,"xfsroot.",8);
                iVar3 = local_10ec;
                if (iVar6 != 0) {
                  if (local_10ec < 0) {
                    if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
                      sVar12 = lgetxattr(local_10d8,__s1,(void *)0x0,0);
                    }
                    else {
                      sVar12 = getxattr(local_10d8,__s1,(void *)0x0,0);
                    }
                  }
                  else {
                    sVar12 = fgetxattr(local_10ec,__s1,(void *)0x0,0);
                  }
                  if (sVar12 == 0xffffffffffffffff) {
                    piVar13 = __errno_location();
                    iVar3 = *piVar13;
                    pcVar8 = "Couldn\'t query extended attribute";
LAB_0012213b:
                    archive_set_error(_a,iVar3,pcVar8);
                    pcVar10 = local_10e8;
                    uVar15 = local_10e0;
                  }
                  else {
                    if ((long)sVar12 < 1) {
                      __value = (void *)0x0;
                    }
                    else {
                      __value = malloc(sVar12);
                      if (__value == (void *)0x0) {
                        piVar13 = __errno_location();
                        iVar3 = *piVar13;
                        pcVar8 = "Out of memory";
                        goto LAB_0012213b;
                      }
                    }
                    if (iVar3 < 0) {
                      if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
                        size = lgetxattr(local_10d8,__s1,__value,sVar12);
                      }
                      else {
                        size = getxattr(local_10d8,__s1,__value,sVar12);
                      }
                    }
                    else {
                      size = fgetxattr(iVar3,__s1,__value,sVar12);
                    }
                    uVar15 = local_10e0;
                    pcVar10 = local_10e8;
                    if (size == 0xffffffffffffffff) {
                      piVar13 = __errno_location();
                      archive_set_error(_a,*piVar13,"Couldn\'t read extended attribute");
                    }
                    else {
                      archive_entry_xattr_add_entry(entry,__s1,__value,size);
                    }
                    free(__value);
                  }
                }
              }
LAB_001221de:
              sVar12 = strlen(__s1);
              pcVar2 = local_10e8;
              pcVar8 = local_10d8;
            }
            free(pcVar10);
            iVar3 = 0;
          }
        }
      }
    }
  }
  if (((ulong)_a[1].error_string.s & 0x80) != 0) goto LAB_001225e3;
  mVar5 = archive_entry_filetype(entry);
  iVar6 = 0;
  if (((mVar5 == 0x8000) && (lVar9 = archive_entry_size(entry), 0 < lVar9)) &&
     (pcVar8 = archive_entry_hardlink(entry), pcVar8 == (char *)0x0)) {
    if ((local_10ec < 0) &&
       (pcVar8 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10ec),
       local_10ec < 0)) {
      iVar6 = -0x19;
      if (pcVar8 != (char *)0x0) {
        local_10ec = open(pcVar8,0x80800);
        if (-1 < local_10ec) {
          __archive_ensure_cloexec_flag(local_10ec);
          pcVar8 = (char *)0x0;
          goto LAB_001222b2;
        }
LAB_00122659:
        iVar6 = -0x19;
        piVar13 = __errno_location();
        archive_set_error(_a,*piVar13,"Can\'t open `%s\'",pcVar8);
      }
    }
    else {
      pcVar10 = (char *)lseek(local_10ec,0,1);
      pcVar8 = (char *)0x0;
      if (pcVar10 != (char *)0x0) {
        lseek(local_10ec,0,0);
        pcVar8 = pcVar10;
      }
LAB_001222b2:
      iVar6 = 0;
      _Var14 = lseek(local_10ec,0,4);
      if (_Var14 < 0) {
        mVar5 = archive_entry_filetype(entry);
        if (((mVar5 == 0x8000) && (lVar9 = archive_entry_size(entry), 0 < lVar9)) &&
           (pcVar8 = archive_entry_hardlink(entry), pcVar8 == (char *)0x0)) {
          if (local_10ec < 0) {
            pcVar8 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,(int *)0x0);
            iVar6 = -0x19;
            if (pcVar8 == (char *)0x0) goto LAB_001225dc;
            if (*(long *)&_a[1].archive_format == 0) {
              local_10ec = open(pcVar8,0x80800);
            }
            else {
              local_10ec = (*(code *)_a[1].archive_format_name)
                                     (*(long *)&_a[1].archive_format,pcVar8,0x80800);
            }
            if (local_10ec < 0) goto LAB_00122659;
            __archive_ensure_cloexec_flag(local_10ec);
          }
          memset(&stflags,0,0x1000);
          local_1030 = 0xffffffffffffffff;
          local_1028 = 1;
          local_1020 = 0x48;
          local_10e0 = archive_entry_size(entry);
          iVar19 = 0;
          local_10d8 = (char *)0xc020660b;
          while (iVar6 = ioctl(local_10ec,(ulong)local_10d8,&stflags), -1 < iVar6) {
            local_10e8 = (char *)CONCAT44(local_10e8._4_4_,iVar19);
            if (local_1024 == 0) {
              iVar6 = 0;
              if (iVar19 == 0) {
                iVar6 = 0;
                archive_entry_sparse_add_entry(entry,0,0);
              }
              goto LAB_001225dc;
            }
            puVar18 = local_ff0;
            bVar1 = true;
            uVar4 = local_1024;
            for (iVar19 = 0; iVar19 < (int)uVar4; iVar19 = iVar19 + 1) {
              uVar16 = *puVar18;
              if ((uVar16 >> 0xb & 1) == 0) {
                offset = *(long *)(puVar18 + -10);
                uVar15 = offset + *(long *)(puVar18 + -6);
                iVar6 = 0;
                lVar17 = 0;
                if (local_10e0 <= uVar15) {
                  lVar17 = uVar15 - local_10e0;
                }
                uVar15 = *(long *)(puVar18 + -6) - lVar17;
                if (uVar15 == local_10e0 && offset == 0) goto LAB_001225dc;
                if (0 < (long)uVar15) {
                  archive_entry_sparse_add_entry(entry,offset,uVar15);
                  uVar16 = *puVar18;
                  uVar4 = local_1024;
                }
              }
              if ((uVar16 & 1) != 0) {
                bVar1 = false;
              }
              puVar18 = puVar18 + 0xe;
            }
            if (!bVar1) break;
            _stflags = s.__glibc_reserved[(ulong)uVar4 * 7 + 2] +
                       s.__glibc_reserved[(ulong)uVar4 * 7];
            iVar19 = (int)local_10e8 + 1;
          }
          iVar6 = 0;
        }
      }
      else {
        local_10e8 = pcVar8;
        if (_Var14 != 0) {
          lseek(local_10ec,0,0);
        }
        local_10e0 = archive_entry_size(entry);
        iVar6 = 0;
        uVar15 = 0;
        while (pcVar8 = local_10e8, (long)uVar15 < (long)local_10e0) {
          _Var14 = lseek(local_10ec,uVar15,3);
          if (_Var14 == -1) {
            piVar13 = __errno_location();
            pcVar8 = local_10e8;
            iVar6 = *piVar13;
            if (iVar6 == 6) {
              wVar7 = archive_entry_sparse_count(entry);
              iVar6 = 0;
              if (wVar7 == L'\0') {
                iVar6 = 0;
                _Var14 = lseek(local_10ec,0,4);
                if (_Var14 == 0) {
                  iVar6 = 0;
                  uVar15 = lseek(local_10ec,0,2);
                  if (uVar15 == local_10e0) {
                    iVar6 = 0;
                    archive_entry_sparse_add_entry(entry,0,0);
                  }
                }
              }
            }
            else {
              pcVar10 = "lseek(SEEK_HOLE) failed";
LAB_001225be:
              archive_set_error(_a,iVar6,pcVar10);
              iVar6 = -0x19;
            }
            break;
          }
          uVar15 = lseek(local_10ec,_Var14,4);
          if (uVar15 == 0xffffffffffffffff) {
            piVar13 = __errno_location();
            pcVar8 = local_10e8;
            iVar6 = *piVar13;
            if (iVar6 == 6) {
              _Var14 = lseek(local_10ec,0,2);
              iVar6 = 0;
              if (_Var14 != -1) break;
              iVar6 = *piVar13;
            }
            pcVar10 = "lseek(SEEK_DATA) failed";
            goto LAB_001225be;
          }
          pcVar8 = local_10e8;
          if (uVar15 == local_10e0 && _Var14 == 0) break;
          archive_entry_sparse_add_entry(entry,_Var14,uVar15 - _Var14);
        }
        lseek(local_10ec,(__off_t)pcVar8,0);
      }
    }
  }
LAB_001225dc:
  if (iVar6 < iVar3) {
    iVar3 = iVar6;
  }
LAB_001225e3:
  if (local_10ec != local_10cc) {
    close(local_10ec);
  }
  return iVar3;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC, ARCHIVE_STATE_ANY,
		"archive_read_disk_entry_from_file");

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (la_stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 && st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS)) || \
    (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS))
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 &&
	    (S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd,
#if defined(FS_IOC_GETFLAGS)
			    FS_IOC_GETFLAGS,
#else
			    EXT2_IOC_GETFLAGS,
#endif
			    &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len + 1);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = '\0';
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = 0;
	if ((a->flags & ARCHIVE_READDISK_NO_ACL) == 0)
		r = archive_read_disk_entry_setup_acls(a, entry, &fd);
	if ((a->flags & ARCHIVE_READDISK_NO_XATTR) == 0) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->flags & ARCHIVE_READDISK_MAC_COPYFILE) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if ((a->flags & ARCHIVE_READDISK_NO_SPARSE) == 0) {
		r1 = setup_sparse(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}